

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::FillBox
          (ChMatterMeshless *this,ChVector<double> *size,double spacing,double initial_density,
          ChCoordsys<double> *boxcoords,bool do_centeredcube,double kernel_sfactor,double randomness
          )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  long lVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 in_register_00001208 [56];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  shared_ptr<chrono::fea::ChNodeMeshless> mnode;
  ChVector<double> v;
  ChVector<double> local_1c8;
  double local_1a8;
  uint local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  undefined4 local_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  double local_160;
  ChVector<double> local_158;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  double local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  double local_88;
  undefined1 local_78 [16];
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  auVar17._8_56_ = in_register_00001208;
  auVar17._0_8_ = spacing;
  local_178 = auVar17._0_16_;
  auVar17 = ZEXT1664(local_178);
  local_18c = (undefined4)CONCAT71(in_register_00000009,do_centeredcube);
  local_188._8_8_ = spacing;
  local_188._0_8_ = spacing;
  auVar18 = ZEXT1664(local_188);
  iVar10 = 0;
  local_1a0 = (uint)(size->m_data[0] / spacing);
  local_194 = (uint)(size->m_data[1] / spacing);
  local_19c = (uint)(size->m_data[2] / spacing);
  local_19c = ~((int)local_19c >> 0x1f) & local_19c;
  local_194 = ~((int)local_194 >> 0x1f) & local_194;
  local_1a0 = ~((int)local_1a0 >> 0x1f) & local_1a0;
  local_d8 = randomness * 0.5;
  local_98 = (double)((ulong)do_centeredcube * (long)local_d8 +
                     (ulong)!do_centeredcube * (long)randomness);
  uStack_b0 = 0;
  local_e8 = spacing * 0.5;
  local_a8._8_8_ = 0xbfe0000000000000;
  local_a8._0_8_ = 0xbfe0000000000000;
  uStack_c0 = 0;
  local_138 = 0.0;
  uVar7 = 0;
  local_160 = initial_density;
  local_f0 = kernel_sfactor;
  dStack_e0 = local_e8;
  dStack_d0 = local_d8;
  local_c8 = local_e8;
  local_b8 = local_d8;
  dStack_90 = local_98;
  local_88 = local_98;
  while (uStack_130 = 0, uVar7 != local_1a0) {
    local_128 = 0.0;
    uVar8 = 0;
    local_198 = uVar7;
    while (uStack_120 = 0, uVar8 != local_194) {
      auVar1._8_8_ = uStack_130;
      auVar1._0_8_ = local_138;
      auVar16 = ZEXT864(0) << 0x40;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_128;
      local_78 = vunpcklpd_avx(auVar1,auVar2);
      uVar7 = local_19c;
      local_190 = uVar8;
      while( true ) {
        bVar12 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if (bVar12) break;
        local_1a8 = auVar16._0_8_;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = size->m_data[2] * -0.5;
        auVar1 = vfmadd231sd_fma(auVar14,auVar16._0_16_,auVar17._0_16_);
        auVar15._0_8_ = (double)local_a8._0_8_ * size->m_data[0];
        auVar15._8_8_ = (double)local_a8._8_8_ * size->m_data[1];
        local_1c8.m_data._0_16_ = vfmadd231pd_fma(auVar15,auVar18._0_16_,local_78);
        local_1c8.m_data[2] = auVar1._0_8_;
        local_108 = ChRandom();
        uStack_100 = extraout_XMM0_Qb;
        local_118 = ChRandom();
        uStack_110 = extraout_XMM0_Qb_00;
        dVar13 = ChRandom();
        auVar5._8_8_ = uStack_100;
        auVar5._0_8_ = local_108;
        auVar3._8_8_ = uStack_110;
        auVar3._0_8_ = local_118;
        auVar1 = vunpcklpd_avx(auVar5,auVar3);
        local_1c8.m_data[1] =
             (double)(auVar1._8_8_ * dStack_90 * (double)local_188._8_8_ + local_1c8.m_data[1]);
        local_1c8.m_data[0] =
             (double)(auVar1._0_8_ * local_98 * (double)local_188._0_8_ + local_1c8.m_data[0]);
        local_1c8.m_data[2] = dVar13 * local_88 * (double)local_178._0_8_ + local_1c8.m_data[2];
        ChCoordsys<double>::TransformLocalToParent(&local_60,boxcoords,&local_1c8);
        AddNode(this,&local_60);
        if ((char)local_18c == '\0') {
          iVar10 = iVar10 + 1;
        }
        else {
          local_158.m_data[0] = local_e8 + local_1c8.m_data[0];
          local_158.m_data[1] = dStack_e0 + local_1c8.m_data[1];
          local_158.m_data[2] = local_c8 + local_1c8.m_data[2];
          local_108 = ChRandom();
          uStack_100 = extraout_XMM0_Qb_01;
          local_118 = ChRandom();
          uStack_110 = extraout_XMM0_Qb_02;
          dVar13 = ChRandom();
          auVar6._8_8_ = uStack_100;
          auVar6._0_8_ = local_108;
          auVar4._8_8_ = uStack_110;
          auVar4._0_8_ = local_118;
          auVar1 = vunpcklpd_avx(auVar6,auVar4);
          local_158.m_data[0] =
               auVar1._0_8_ * local_d8 * (double)local_188._0_8_ + local_158.m_data[0];
          local_158.m_data[1] =
               auVar1._8_8_ * dStack_d0 * (double)local_188._8_8_ + local_158.m_data[1];
          local_158.m_data[2] = dVar13 * local_b8 * (double)local_178._0_8_ + local_158.m_data[2];
          ChCoordsys<double>::TransformLocalToParent(&local_48,boxcoords,&local_158);
          AddNode(this,&local_48);
          iVar10 = iVar10 + 2;
        }
        auVar17 = ZEXT1664(local_178);
        auVar18 = ZEXT1664(local_188);
        auVar16 = ZEXT864((ulong)(local_1a8 + 1.0));
      }
      local_128 = local_128 + 1.0;
      uVar8 = local_190 + 1;
    }
    local_138 = local_138 + 1.0;
    uVar7 = local_198 + 1;
  }
  lVar9 = 0;
  local_188._0_8_ = auVar17._0_8_ * local_f0;
  uVar11 = 0;
  local_1a8 = (size->m_data[0] * size->m_data[1] * size->m_data[2] * local_160) / (double)iVar10;
  local_178._0_8_ = auVar17._0_8_ * 0.1;
  while( true ) {
    uVar7 = (*(this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])(this);
    if (uVar7 <= uVar11) {
      (((this->material).
        super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->super_ChContinuumElastic).super_ChContinuumMaterial.density = local_160;
      return;
    }
    std::__shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2> *)&local_1c8,
               (__shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this->nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar9));
    if ((ChNodeMeshless *)local_1c8.m_data[0] == (ChNodeMeshless *)0x0) break;
    ChNodeMeshless::SetKernelRadius((ChNodeMeshless *)local_1c8.m_data[0],(double)local_188._0_8_);
    ChNodeMeshless::SetCollisionRadius
              ((ChNodeMeshless *)local_1c8.m_data[0],(double)local_178._0_8_);
    (**(code **)((long)((ChNodeXYZ *)local_1c8.m_data[0])->super_ChLoadableUVW + 0x98))(local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8.m_data + 1));
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 0x10;
  }
  __assert_fail("mnode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                ,0xfb,
                "void chrono::fea::ChMatterMeshless::FillBox(const ChVector<>, const double, const double, const ChCoordsys<>, const bool, const double, const double)"
               );
}

Assistant:

void ChMatterMeshless::FillBox(const ChVector<> size,
                               const double spacing,
                               const double initial_density,
                               const ChCoordsys<> boxcoords,
                               const bool do_centeredcube,
                               const double kernel_sfactor,
                               const double randomness) {
    int samples_x = (int)(size.x() / spacing);
    int samples_y = (int)(size.y() / spacing);
    int samples_z = (int)(size.z() / spacing);
    int totsamples = 0;

    double mrandomness = randomness;
    if (do_centeredcube)
        mrandomness = randomness * 0.5;

    for (int ix = 0; ix < samples_x; ix++)
        for (int iy = 0; iy < samples_y; iy++)
            for (int iz = 0; iz < samples_z; iz++) {
                ChVector<> pos(ix * spacing - 0.5 * size.x(), iy * spacing - 0.5 * size.y(), iz * spacing - 0.5 * size.z());
                pos += ChVector<>(mrandomness * ChRandom() * spacing, mrandomness * ChRandom() * spacing,
                                  mrandomness * ChRandom() * spacing);
                AddNode(boxcoords.TransformLocalToParent(pos));
                totsamples++;

                if (do_centeredcube) {
                    ChVector<> pos2 = pos + 0.5 * ChVector<>(spacing, spacing, spacing);
                    pos2 += ChVector<>(mrandomness * ChRandom() * spacing, mrandomness * ChRandom() * spacing,
                                       mrandomness * ChRandom() * spacing);
                    AddNode(boxcoords.TransformLocalToParent(pos2));
                    totsamples++;
                }
            }

    double mtotvol = size.x() * size.y() * size.z();
    double mtotmass = mtotvol * initial_density;
    double nodemass = mtotmass / (double)totsamples;
    double kernelrad = kernel_sfactor * spacing;

    for (unsigned int ip = 0; ip < GetNnodes(); ip++) {
        // downcasting
        std::shared_ptr<ChNodeMeshless> mnode(nodes[ip]);
        assert(mnode);

        mnode->SetKernelRadius(kernelrad);
        mnode->SetCollisionRadius(spacing * 0.1);
        mnode->SetMass(nodemass);
    }

    GetMaterial()->Set_density(initial_density);
}